

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_compositions.h
# Opt level: O0

CompositionMatcher * __thiscall
icu_63::numparse::impl::CompositionMatcher::operator=
          (CompositionMatcher *this,CompositionMatcher *param_1)

{
  CompositionMatcher *param_1_local;
  CompositionMatcher *this_local;
  
  NumberParseMatcher::operator=(&this->super_NumberParseMatcher,&param_1->super_NumberParseMatcher);
  return this;
}

Assistant:

class U_I18N_API CompositionMatcher : public NumberParseMatcher {
  protected:
    // No construction except by subclasses!
    CompositionMatcher() = default;

    // To be overridden by subclasses (used for iteration):
    virtual const NumberParseMatcher* const* begin() const = 0;

    // To be overridden by subclasses (used for iteration):
    virtual const NumberParseMatcher* const* end() const = 0;
}